

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O3

nng_err nni_pipe_getopt(nni_pipe *p,char *name,void *val,size_t *szp,nni_opt_type t)

{
  nng_err nVar1;
  
  nVar1 = (*(p->p_tran_ops).p_getopt)(p->p_tran_data,name,val,szp,t);
  if (nVar1 == NNG_ENOTSUP) {
    if (p->p_dialer != (nni_dialer *)0x0) {
      nVar1 = nni_dialer_getopt(p->p_dialer,name,val,szp,t);
      return nVar1;
    }
    if (p->p_listener != (nni_listener *)0x0) {
      nVar1 = nni_listener_getopt(p->p_listener,name,val,szp,t);
      return nVar1;
    }
    nVar1 = NNG_ENOTSUP;
  }
  return nVar1;
}

Assistant:

nng_err
nni_pipe_getopt(
    nni_pipe *p, const char *name, void *val, size_t *szp, nni_opt_type t)
{
	nng_err rv;

	rv = p->p_tran_ops.p_getopt(p->p_tran_data, name, val, szp, t);
	if (rv != NNG_ENOTSUP) {
		return (rv);
	}

	// Maybe the endpoint knows? The guarantees on pipes ensure that the
	// pipe will not outlive its creating endpoint.
	if (p->p_dialer != NULL) {
		return (nni_dialer_getopt(p->p_dialer, name, val, szp, t));
	}
	if (p->p_listener != NULL) {
		return (nni_listener_getopt(p->p_listener, name, val, szp, t));
	}
	return (NNG_ENOTSUP);
}